

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngunknown.c
# Opt level: O2

int main(int argc,char **argv)

{
  char **argv_00;
  int iVar1;
  int iVar2;
  int iVar3;
  FILE *pFVar4;
  char *this_test;
  char *pcVar5;
  char *pcVar6;
  char **ppcVar7;
  uint argc_00;
  int iVar8;
  char *local_170;
  char *count_argv;
  png_uint_32 default_flags [4];
  display d;
  
  count_argv = "default=save";
  pcVar6 = *argv;
  local_170 = (char *)0x0;
  memset(&d,0,0xf8);
  d.test = "initialization";
  iVar3 = 0;
  iVar2 = 0;
  d.program = pcVar6;
  d.file = pcVar6;
  while( true ) {
    do {
      iVar8 = iVar2;
      ppcVar7 = argv + 1;
      argc_00 = argc - 1;
      iVar2 = iVar3;
      do {
        iVar3 = iVar2;
        argc = argc_00;
        argv = ppcVar7;
        if ((int)(argc + 1U) < 2) {
          pcVar5 = "missing test file";
          goto LAB_0010264d;
        }
        pcVar5 = *argv;
        iVar1 = strcmp(pcVar5,"--strict");
        ppcVar7 = argv + 1;
        argc_00 = argc - 1;
        iVar2 = 1;
      } while (iVar1 == 0);
      iVar1 = strcmp(pcVar5,"--default");
    } while (iVar1 == 0);
    iVar2 = strcmp(pcVar5,"--touch");
    if (iVar2 != 0) break;
    if (argc_00 == 0) {
      pcVar5 = "--touch: missing file name";
LAB_0010264d:
      usage(pcVar6,pcVar5);
    }
    local_170 = *ppcVar7;
    argv = ppcVar7;
    iVar2 = iVar8;
    argc = argc_00;
  }
  if ((iVar8 == 0) || (argc_00 == 0)) {
    pcVar6 = argv[argc_00];
    d.file = pcVar6;
    pFVar4 = fopen(pcVar6,"rb");
    if (pFVar4 == (FILE *)0x0) {
      perror(pcVar6);
    }
    else {
      iVar2 = check((FILE *)pFVar4,1,&count_argv,default_flags,&d,0);
      if (iVar2 == 3) {
        if (iVar8 == 0) {
          d.test = "command line";
          perform_one_test((FILE *)pFVar4,argc_00,argv,default_flags,&d,0);
          perform_one_test((FILE *)pFVar4,argc_00,argv,default_flags,&d,1);
          d.test = "initialization";
        }
        else {
          ppcVar7 = standard_tests;
          while (iVar2 = d.error_count, pcVar6 = *ppcVar7, pcVar6 != (char *)0x0) {
            iVar8 = iVar3;
            if (iVar3 != 0) {
              iVar8 = d.warning_count;
            }
            argv_00 = ppcVar7 + 1;
            iVar1 = 0;
            for (ppcVar7 = ppcVar7 + 2; ppcVar7[-1] != (char *)0x0; ppcVar7 = ppcVar7 + 1) {
              iVar1 = iVar1 + 1;
            }
            perform_one_test_safe((FILE *)pFVar4,iVar1,argv_00,default_flags,&d,pcVar6);
            iVar1 = iVar3;
            if (iVar3 != 0) {
              iVar1 = d.warning_count;
            }
            pcVar5 = "FAIL";
            if (iVar1 + d.error_count == iVar8 + iVar2) {
              pcVar5 = "PASS";
            }
            printf("%s: %s %s\n",pcVar5,d.program,pcVar6);
          }
        }
        fclose(pFVar4);
        if (iVar3 != 0) {
          iVar3 = d.warning_count;
        }
        iVar2 = 1;
        if ((iVar3 + d.error_count != 0) || (iVar2 = 0, local_170 == (char *)0x0)) {
          return iVar2;
        }
        pFVar4 = fopen(local_170,"wt");
        if (pFVar4 == (FILE *)0x0) {
          pcVar6 = "%s: open failed\n";
        }
        else {
          fwrite("PNG unknown tests succeeded\n",0x1c,1,pFVar4);
          fflush(pFVar4);
          iVar2 = ferror(pFVar4);
          iVar3 = fclose(pFVar4);
          if (iVar3 == 0 && iVar2 == 0) {
            return 0;
          }
          pcVar6 = "%s: write failed\n";
        }
        fprintf(_stderr,pcVar6,local_170);
      }
      else {
        fprintf(_stderr,"%s: %s: internal error\n",d.program,d.file);
      }
    }
    exit(99);
  }
  pcVar5 = "extra arguments";
  goto LAB_0010264d;
}

Assistant:

int
main(int argc, const char **argv)
{
   FILE *fp;
   png_uint_32 default_flags[4]; /*valid,unknown{before,after}*/
   int strict = 0, default_tests = 0;
   const char *count_argv = "default=save";
   const char *touch_file = NULL;
   display d;

   init_display(&d, argv[0]);

   while (++argv, --argc > 0)
   {
      if (strcmp(*argv, "--strict") == 0)
         strict = 1;

      else if (strcmp(*argv, "--default") == 0)
         default_tests = 1;

      else if (strcmp(*argv, "--touch") == 0)
      {
         if (argc > 1)
            touch_file = *++argv, --argc;

         else
            usage(d.program, "--touch: missing file name");
      }

      else
         break;
   }

   /* A file name is required, but there should be no other arguments if
    * --default was specified.
    */
   if (argc <= 0)
      usage(d.program, "missing test file");

   /* GCC BUG: if (default_tests && argc != 1) triggers some weird GCC argc
    * optimization which causes warnings with -Wstrict-overflow!
    */
   else if (default_tests)
      if (argc != 1)
         usage(d.program, "extra arguments");

   /* The name of the test file is the last argument; remove it. */
   d.file = argv[--argc];

   fp = fopen(d.file, "rb");
   if (fp == NULL)
   {
      perror(d.file);
      exit(99);
   }

   /* First find all the chunks, known and unknown, in the test file, a failure
    * here aborts the whole test.
    *
    * If 'save' is supported then the normal saving method should happen,
    * otherwise if 'read' is supported then the read callback will do the
    * same thing.  If both are supported the 'read' callback won't be
    * instantiated by default.  If 'save' is *not* supported then a user
    * callback is required even though we can call png_get_unknown_chunks.
    */
   if (check(fp, 1, &count_argv, default_flags, &d,
#     ifdef PNG_SAVE_UNKNOWN_CHUNKS_SUPPORTED
         0
#     else
         1
#     endif
      ) != PNG_HANDLE_CHUNK_ALWAYS)
   {
      fprintf(stderr, "%s: %s: internal error\n", d.program, d.file);
      exit(99);
   }

   /* Now find what the various supplied options cause to change: */
   if (!default_tests)
   {
      d.test = cmd; /* acts as a flag to say exit, do not longjmp */
#     ifdef PNG_SAVE_UNKNOWN_CHUNKS_SUPPORTED
         perform_one_test(fp, argc, argv, default_flags, &d, 0);
#     endif
#     ifdef PNG_READ_USER_CHUNKS_SUPPORTED
         perform_one_test(fp, argc, argv, default_flags, &d, 1);
#     endif
      d.test = init;
   }

   else
   {
      const char **test = standard_tests;

      /* Set the exit_test pointer here so we can continue after a libpng error.
       * NOTE: this leaks memory because the png_struct data from the failing
       * test is never freed.
       */
      while (*test)
      {
         const char *this_test = *test++;
         const char **next = test;
         int count = display_rc(&d, strict), new_count;
         const char *result;
         int arg_count = 0;

         while (*next != NULL)
         {
            ++next;
            ++arg_count;
         }

         perform_one_test_safe(fp, arg_count, test, default_flags, &d,
            this_test);

         new_count = display_rc(&d, strict);

         if (new_count == count)
            result = "PASS";

         else
            result = "FAIL";

         printf("%s: %s %s\n", result, d.program, this_test);

         test = next+1;
      }
   }

   fclose(fp);

   if (display_rc(&d, strict) == 0)
   {
      /* Success, touch the success file if appropriate */
      if (touch_file != NULL)
      {
         FILE *fsuccess = fopen(touch_file, "wt");

         if (fsuccess != NULL)
         {
            int err = 0;
            fprintf(fsuccess, "PNG unknown tests succeeded\n");
            fflush(fsuccess);
            err = ferror(fsuccess);

            if (fclose(fsuccess) || err)
            {
               fprintf(stderr, "%s: write failed\n", touch_file);
               exit(99);
            }
         }

         else
         {
            fprintf(stderr, "%s: open failed\n", touch_file);
            exit(99);
         }
      }

      return 0;
   }

   return 1;
}